

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryBuilder::readNames(WasmBinaryBuilder *this,size_t payloadLen)

{
  long lVar1;
  IString *pIVar2;
  long lVar3;
  long *plVar4;
  pointer puVar5;
  pointer pHVar6;
  undefined8 uVar7;
  char cVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  ostream *poVar14;
  size_t sVar15;
  __node_base_ptr p_Var16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  uint uVar19;
  ulong uVar20;
  long *plVar21;
  ulong uVar22;
  Name NVar23;
  Name NVar24;
  IString IVar25;
  string_view sVar26;
  string local_168;
  string local_148;
  __node_base_ptr local_128;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_120;
  ulong local_118;
  ulong local_110;
  long *local_108;
  long local_100;
  long local_f8 [2];
  long local_e8;
  ulong local_e0;
  size_t local_d8;
  ulong local_d0;
  __node_base_ptr local_c8;
  uint32_t local_bc;
  undefined1 auStack_b8 [4];
  uint32_t localIndex;
  NameProcessor processor;
  long *local_78;
  uint32_t fieldIndex;
  undefined4 uStack_6c;
  long local_68 [2];
  size_type *local_58;
  string __str;
  
  local_d8 = payloadLen;
  bVar9 = isDebugEnabled("binary");
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"== readNames\n",0xd);
  }
  uVar20 = this->pos;
  local_d8 = local_d8 + uVar20;
  local_d0 = 0;
  __str.field_2._8_8_ = this;
  do {
    if (local_d8 <= uVar20) {
      if (uVar20 != local_d8) {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"bad names section position change","");
        throwError(this,&local_148);
      }
      return;
    }
    uVar12 = getU32LEB(this);
    if (uVar12 <= (uint)local_d0 && (uint)local_d0 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: out-of-order name subsection: ",0x27);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
    }
    uVar7 = __str.field_2._8_8_;
    local_d0 = (ulong)uVar12;
    uVar13 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
    this = (WasmBinaryBuilder *)__str.field_2._8_8_;
    local_e8 = *(long *)(uVar7 + 0x38);
    local_e0 = (ulong)uVar13;
    switch(uVar12) {
    case 0:
      IVar25.str = (string_view)getInlineString((WasmBinaryBuilder *)__str.field_2._8_8_);
      ((IString *)(*(long *)this + 0x110))->str = IVar25.str;
      goto LAB_00967670;
    case 1:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar12 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          uVar12 = getU32LEB(this);
          NVar23 = getInlineString(this);
          NVar24 = escape(NVar23);
          IVar25.str = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24);
          lVar1 = *(long *)(*(long *)__str.field_2._8_8_ + 0x18);
          if ((ulong)uVar12 < (ulong)(*(long *)(*(long *)__str.field_2._8_8_ + 0x20) - lVar1 >> 3))
          {
            pIVar2 = *(IString **)(lVar1 + (ulong)uVar12 * 8);
            pIVar2->str = IVar25.str;
            *(undefined1 *)&pIVar2[1].str = 1;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: function index out of bounds in name section, function subsection: "
                       ,0x4c);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar23.super_IString.str._M_str,
                       NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_00966e4f;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_00966e4f;
                }
                if (uVar13 < 10000) goto LAB_00966e4f;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_00966e4f:
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_58,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
        } while (p_Var16 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 2:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      if (uVar12 != 0) {
        local_110 = (ulong)uVar12;
        uVar20 = 0;
        do {
          local_118 = uVar20;
          uVar12 = getU32LEB(this);
          puVar5 = (this->wasm->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar12 <
              (ulong)((long)(this->wasm->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3)) {
            processor.usedNames._M_h._M_single_bucket =
                 *(__node_base_ptr *)
                  &puVar5[uVar12]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: function index out of bounds in name section, local subsection: ",
                       0x49);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_009667da;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_009667da;
                }
                if (uVar13 < 10000) goto LAB_009667da;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_009667da:
            _auStack_b8 = &processor.usedNames._M_h._M_bucket_count;
            std::__cxx11::string::_M_construct((ulong)auStack_b8,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)_auStack_b8,(uint)processor.usedNames._M_h._M_buckets,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)_auStack_b8,
                                 (long)processor.usedNames._M_h._M_buckets);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (_auStack_b8 != &processor.usedNames._M_h._M_bucket_count) {
              operator_delete(_auStack_b8,processor.usedNames._M_h._M_bucket_count + 1);
            }
            processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
          }
          uVar12 = getU32LEB(this);
          _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
          processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
          processor.usedNames._M_h._M_bucket_count = 0;
          processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
          processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
          processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
          if (uVar12 != 0) {
            local_128 = (__node_base_ptr)(ulong)uVar12;
            local_120 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(processor.usedNames._M_h._M_single_bucket + 0xe);
            p_Var16 = (__node_base_ptr)0x0;
            do {
              local_bc = getU32LEB(this);
              NVar23 = getInlineString(this);
              if (processor.usedNames._M_h._M_single_bucket != (__node_base_ptr)0x0) {
                local_c8 = p_Var16;
                NVar24 = escape(NVar23);
                sVar26 = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24)
                ;
                if (sVar26._M_len == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"warning: empty local name at index ",0x23);
                  uVar12 = local_bc;
                  p_Var16 = local_c8;
                  cVar10 = '\x01';
                  if (9 < local_bc) {
                    uVar13 = local_bc;
                    cVar8 = '\x04';
                    do {
                      cVar10 = cVar8;
                      if (uVar13 < 100) {
                        cVar10 = cVar10 + -2;
                        goto LAB_00966ac5;
                      }
                      if (uVar13 < 1000) {
                        cVar10 = cVar10 + -1;
                        goto LAB_00966ac5;
                      }
                      if (uVar13 < 10000) goto LAB_00966ac5;
                      bVar9 = 99999 < uVar13;
                      uVar13 = uVar13 / 10000;
                      cVar8 = cVar10 + '\x04';
                    } while (bVar9);
                    cVar10 = cVar10 + '\x01';
                  }
LAB_00966ac5:
                  local_78 = local_68;
                  std::__cxx11::string::_M_construct((ulong)&local_78,cVar10);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)local_78,fieldIndex,uVar12);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,(char *)local_78,
                                       CONCAT44(uStack_6c,fieldIndex));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14," in function ",0xd);
                  local_58 = &__str._M_string_length;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_58,processor.usedNames._M_h._M_single_bucket[1]._M_nxt
                             ,(long)&(processor.usedNames._M_h._M_single_bucket[1]._M_nxt)->_M_nxt +
                              (long)&(processor.usedNames._M_h._M_single_bucket)->_M_nxt->_M_nxt);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14,(char *)local_58,
                                       CONCAT44(__str._M_dataplus._M_p._4_4_,
                                                (uint)__str._M_dataplus._M_p));
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                  std::ostream::put((char)poVar14);
                  std::ostream::flush();
                  if (local_58 != &__str._M_string_length) {
                    operator_delete(local_58,__str._M_string_length + 1);
                  }
                  this = (WasmBinaryBuilder *)__str.field_2._8_8_;
                  if (local_78 != local_68) {
LAB_00966b97:
                    operator_delete(local_78,local_68[0] + 1);
                  }
                }
                else {
                  uVar20 = (ulong)local_bc;
                  sVar15 = Function::getNumLocals
                                     ((Function *)processor.usedNames._M_h._M_single_bucket);
                  if (uVar20 < sVar15) {
                    pmVar18 = std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[](local_120,&local_bc);
                    (pmVar18->super_IString).str = sVar26;
                    p_Var16 = local_c8;
                    this = (WasmBinaryBuilder *)__str.field_2._8_8_;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "warning: local index out of bounds in name section, local subsection: "
                               ,0x46);
                    local_78 = local_68;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_78,NVar23.super_IString.str._M_str,
                               NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(char *)local_78,
                                         CONCAT44(uStack_6c,fieldIndex));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
                    this = (WasmBinaryBuilder *)__str.field_2._8_8_;
                    uVar12 = local_bc;
                    p_Var16 = local_c8;
                    cVar10 = '\x01';
                    if (9 < local_bc) {
                      uVar13 = local_bc;
                      cVar8 = '\x04';
                      do {
                        cVar10 = cVar8;
                        if (uVar13 < 100) {
                          cVar10 = cVar10 + -2;
                          goto LAB_00966bbf;
                        }
                        if (uVar13 < 1000) {
                          cVar10 = cVar10 + -1;
                          goto LAB_00966bbf;
                        }
                        if (uVar13 < 10000) goto LAB_00966bbf;
                        bVar9 = 99999 < uVar13;
                        uVar13 = uVar13 / 10000;
                        cVar8 = cVar10 + '\x04';
                      } while (bVar9);
                      cVar10 = cVar10 + '\x01';
                    }
LAB_00966bbf:
                    local_58 = &__str._M_string_length;
                    std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
                    std::__detail::__to_chars_10_impl<unsigned_int>
                              ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,(char *)local_58,
                                         CONCAT44(__str._M_dataplus._M_p._4_4_,
                                                  (uint)__str._M_dataplus._M_p));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14," in function ",0xd);
                    local_108 = local_f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_108,
                               processor.usedNames._M_h._M_single_bucket[1]._M_nxt,
                               (long)&(processor.usedNames._M_h._M_single_bucket[1]._M_nxt)->_M_nxt
                               + (long)&(processor.usedNames._M_h._M_single_bucket)->_M_nxt->_M_nxt)
                    ;
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,(char *)local_108,local_100);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14)
                    ;
                    std::ostream::put((char)poVar14);
                    std::ostream::flush();
                    if (local_108 != local_f8) {
                      operator_delete(local_108,local_f8[0] + 1);
                    }
                    if (local_58 != &__str._M_string_length) {
                      operator_delete(local_58,__str._M_string_length + 1);
                    }
                    if (local_78 != local_68) goto LAB_00966b97;
                  }
                }
              }
              p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
            } while (p_Var16 != local_128);
          }
          std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)auStack_b8);
          uVar20 = local_118 + 1;
        } while (uVar20 != local_110);
      }
      goto LAB_00967670;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: unknown name subsection with id ",0x29);
      this = (WasmBinaryBuilder *)__str.field_2._8_8_;
      cVar10 = '\x01';
      if (9 < uVar12) {
        uVar20 = local_d0;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          uVar19 = (uint)uVar20;
          if (uVar19 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_009676fd;
          }
          if (uVar19 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_009676fd;
          }
          if (uVar19 < 10000) goto LAB_009676fd;
          uVar20 = (uVar20 & 0xffffffff) / 10000;
          cVar8 = cVar10 + '\x04';
        } while (99999 < uVar19);
        cVar10 = cVar10 + '\x01';
      }
LAB_009676fd:
      _auStack_b8 = &processor.usedNames._M_h._M_bucket_count;
      std::__cxx11::string::_M_construct((ulong)auStack_b8,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)_auStack_b8,(uint)processor.usedNames._M_h._M_buckets,(uint)local_d0);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)_auStack_b8,
                           (long)processor.usedNames._M_h._M_buckets);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," at ",4);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      if (_auStack_b8 != &processor.usedNames._M_h._M_bucket_count) {
        operator_delete(_auStack_b8,processor.usedNames._M_h._M_bucket_count + 1);
      }
      *(ulong *)((long)this + 0x38) = local_e8 + local_e0;
      goto LAB_00967670;
    case 4:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar12 != 0) {
        local_c8 = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          uVar12 = getU32LEB(this);
          processor.usedNames._M_h._M_single_bucket = p_Var16;
          NVar23 = getInlineString(this);
          NVar24 = escape(NVar23);
          sVar26 = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24);
          if ((ulong)uVar12 <
              (ulong)(*(long *)(__str.field_2._8_8_ + 0xb8) - *(long *)(__str.field_2._8_8_ + 0xb0)
                     >> 3)) {
            pmVar17 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(*(long *)__str.field_2._8_8_ + 0x120),
                                   (key_type *)
                                   (*(long *)(__str.field_2._8_8_ + 0xb0) + (ulong)uVar12 * 8));
            (pmVar17->name).super_IString.str = sVar26;
            p_Var16 = processor.usedNames._M_h._M_single_bucket;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: type index out of bounds in name section, type subsection: ",0x44);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar23.super_IString.str._M_str,
                       NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            p_Var16 = processor.usedNames._M_h._M_single_bucket;
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_0096666b;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_0096666b;
                }
                if (uVar13 < 10000) goto LAB_0096666b;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_0096666b:
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_58,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
        } while (p_Var16 != local_c8);
      }
      break;
    case 5:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar12 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          uVar12 = getU32LEB(this);
          NVar23 = getInlineString(this);
          NVar24 = escape(NVar23);
          IVar25.str = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24);
          lVar1 = *(long *)__str.field_2._8_8_;
          if ((ulong)uVar12 < (ulong)(*(long *)(lVar1 + 0xb0) - *(long *)(lVar1 + 0xa8) >> 3)) {
            lVar3 = *(long *)(*(long *)(lVar1 + 0xa8) + (ulong)uVar12 * 8);
            plVar4 = *(long **)(lVar1 + 0x68);
            for (plVar21 = *(long **)(lVar1 + 0x60); plVar21 != plVar4; plVar21 = plVar21 + 1) {
              if (*(long *)(*plVar21 + 0x20) == *(long *)(lVar3 + 8)) {
                ((IString *)(*plVar21 + 0x18))->str = IVar25.str;
              }
            }
            *(string_view *)lVar3 = IVar25.str;
            *(undefined1 *)(lVar3 + 0x10) = 1;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: table index out of bounds in name section, table subsection: ",0x46
                      );
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar23.super_IString.str._M_str,
                       NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_00966230;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_00966230;
                }
                if (uVar13 < 10000) goto LAB_00966230;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_00966230:
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_58,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
        } while (p_Var16 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 6:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar12 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          uVar12 = getU32LEB(this);
          NVar23 = getInlineString(this);
          NVar24 = escape(NVar23);
          IVar25.str = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24);
          lVar1 = *(long *)(*(long *)__str.field_2._8_8_ + 0x78);
          if ((ulong)uVar12 < (ulong)(*(long *)(*(long *)__str.field_2._8_8_ + 0x80) - lVar1 >> 3))
          {
            pIVar2 = *(IString **)(lVar1 + (ulong)uVar12 * 8);
            pIVar2->str = IVar25.str;
            *(undefined1 *)&pIVar2[1].str = 1;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: memory index out of bounds in name section, memory subsection: ",
                       0x48);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar23.super_IString.str._M_str,
                       NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_0096643d;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_0096643d;
                }
                if (uVar13 < 10000) goto LAB_0096643d;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_0096643d:
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_58,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
        } while (p_Var16 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 7:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar12 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          uVar12 = getU32LEB(this);
          NVar23 = getInlineString(this);
          NVar24 = escape(NVar23);
          IVar25.str = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24);
          lVar1 = *(long *)(*(long *)__str.field_2._8_8_ + 0x30);
          if ((ulong)uVar12 < (ulong)(*(long *)(*(long *)__str.field_2._8_8_ + 0x38) - lVar1 >> 3))
          {
            pIVar2 = *(IString **)(lVar1 + (ulong)uVar12 * 8);
            pIVar2->str = IVar25.str;
            *(undefined1 *)&pIVar2[1].str = 1;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: global index out of bounds in name section, global subsection: ",
                       0x48);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar23.super_IString.str._M_str,
                       NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_00967059;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_00967059;
                }
                if (uVar13 < 10000) goto LAB_00967059;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_00967059:
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_58,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
        } while (p_Var16 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 8:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar12 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          uVar12 = getU32LEB(this);
          NVar23 = getInlineString(this);
          NVar24 = escape(NVar23);
          IVar25.str = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24);
          lVar1 = *(long *)(*(long *)__str.field_2._8_8_ + 0x60);
          if ((ulong)uVar12 < (ulong)(*(long *)(*(long *)__str.field_2._8_8_ + 0x68) - lVar1 >> 3))
          {
            pIVar2 = *(IString **)(lVar1 + (ulong)uVar12 * 8);
            pIVar2->str = IVar25.str;
            *(undefined1 *)&pIVar2[1].str = 1;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: elem index out of bounds in name section, elem subsection: ",0x44);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar23.super_IString.str._M_str,
                       NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_00967263;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_00967263;
                }
                if (uVar13 < 10000) goto LAB_00967263;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_00967263:
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_58,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
        } while (p_Var16 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 9:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar12 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          uVar12 = getU32LEB(this);
          NVar23 = getInlineString(this);
          NVar24 = escape(NVar23);
          IVar25.str = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24);
          lVar1 = *(long *)(*(long *)__str.field_2._8_8_ + 0x90);
          if ((ulong)uVar12 < (ulong)(*(long *)(*(long *)__str.field_2._8_8_ + 0x98) - lVar1 >> 3))
          {
            pIVar2 = *(IString **)(lVar1 + (long)p_Var16 * 8);
            pIVar2->str = IVar25.str;
            *(undefined1 *)&pIVar2[1].str = 1;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: data index out of bounds in name section, data subsection: ",0x44);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar23.super_IString.str._M_str,
                       NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_009675c3;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_009675c3;
                }
                if (uVar13 < 10000) goto LAB_009675c3;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_009675c3:
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_58,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
        } while (p_Var16 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 10:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      if (uVar12 != 0) {
        local_c8 = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          processor.usedNames._M_h._M_single_bucket = p_Var16;
          uVar12 = getU32LEB(this);
          uVar20 = (ulong)uVar12;
          pHVar6 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (uVar20 < (ulong)((long)(this->types).
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar6 >> 3)
             ) {
            bVar11 = HeapType::isStruct(pHVar6 + uVar20);
            bVar9 = true;
            if (!bVar11) goto LAB_00967360;
          }
          else {
LAB_00967360:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"warning: invalid field index in name field section\n",
                       0x33);
            bVar9 = false;
          }
          uVar12 = getU32LEB(this);
          _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
          processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
          processor.usedNames._M_h._M_bucket_count = 0;
          processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
          processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
          processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
          if (uVar12 != 0) {
            uVar22 = (ulong)uVar12;
            do {
              uVar12 = getU32LEB(this);
              local_78 = (long *)CONCAT44(local_78._4_4_,uVar12);
              NVar23 = getInlineString(this);
              NVar23 = escape(NVar23);
              sVar26 = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar23);
              if (bVar9) {
                pmVar17 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)(*(long *)__str.field_2._8_8_ + 0x120),
                                       (key_type *)
                                       (uVar20 * 8 + *(long *)(__str.field_2._8_8_ + 0xb0)));
                pmVar18 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&pmVar17->fieldNames,(key_type *)&local_78);
                (pmVar18->super_IString).str = sVar26;
              }
              uVar22 = uVar22 - 1;
              this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            } while (uVar22 != 0);
          }
          std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)auStack_b8);
          p_Var16 = (__node_base_ptr)
                    ((long)&(processor.usedNames._M_h._M_single_bucket)->_M_nxt + 1);
        } while (p_Var16 != local_c8);
      }
      goto LAB_00967670;
    case 0xb:
      uVar12 = getU32LEB((WasmBinaryBuilder *)__str.field_2._8_8_);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar12 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar12;
        p_Var16 = (__node_base_ptr)0x0;
        do {
          uVar12 = getU32LEB(this);
          NVar23 = getInlineString(this);
          NVar24 = escape(NVar23);
          IVar25.str = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar24);
          lVar1 = *(long *)(*(long *)__str.field_2._8_8_ + 0x48);
          if ((ulong)uVar12 < (ulong)(*(long *)(*(long *)__str.field_2._8_8_ + 0x50) - lVar1 >> 3))
          {
            pIVar2 = *(IString **)(lVar1 + (ulong)uVar12 * 8);
            pIVar2->str = IVar25.str;
            *(undefined1 *)&pIVar2[1].str = 1;
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: tag index out of bounds in name section, tag subsection: ",0x42);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar23.super_IString.str._M_str,
                       NVar23.super_IString.str._M_str + NVar23.super_IString.str._M_len);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," at index ",10);
            cVar10 = '\x01';
            if (9 < uVar12) {
              uVar13 = uVar12;
              cVar8 = '\x04';
              do {
                cVar10 = cVar8;
                if (uVar13 < 100) {
                  cVar10 = cVar10 + -2;
                  goto LAB_00965ff5;
                }
                if (uVar13 < 1000) {
                  cVar10 = cVar10 + -1;
                  goto LAB_00965ff5;
                }
                if (uVar13 < 10000) goto LAB_00965ff5;
                bVar9 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar10 + '\x04';
              } while (bVar9);
              cVar10 = cVar10 + '\x01';
            }
LAB_00965ff5:
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_58,cVar10);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar12);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_58,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            this = (WasmBinaryBuilder *)__str.field_2._8_8_;
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var16 = (__node_base_ptr)((long)&p_Var16->_M_nxt + 1);
        } while (p_Var16 != processor.usedNames._M_h._M_single_bucket);
      }
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_b8);
LAB_00967670:
    uVar20 = local_e8 + local_e0;
    if (this->pos != uVar20) {
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"bad names subsection position change","");
      throwError(this,&local_168);
    }
  } while( true );
}

Assistant:

void WasmBinaryBuilder::readNames(size_t payloadLen) {
  BYN_TRACE("== readNames\n");
  auto sectionPos = pos;
  uint32_t lastType = 0;
  while (pos < sectionPos + payloadLen) {
    auto nameType = getU32LEB();
    if (lastType && nameType <= lastType) {
      std::cerr << "warning: out-of-order name subsection: " << nameType
                << std::endl;
    }
    lastType = nameType;
    auto subsectionSize = getU32LEB();
    auto subsectionPos = pos;
    using Subsection = BinaryConsts::CustomSections::Subsection;
    if (nameType == Subsection::NameModule) {
      wasm.name = getInlineString();
    } else if (nameType == Subsection::NameFunction) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.functions.size()) {
          wasm.functions[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: function index out of bounds in name section, "
                       "function subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameLocal) {
      auto numFuncs = getU32LEB();
      for (size_t i = 0; i < numFuncs; i++) {
        auto funcIndex = getU32LEB();
        Function* func = nullptr;
        if (funcIndex < wasm.functions.size()) {
          func = wasm.functions[funcIndex].get();
        } else {
          std::cerr
            << "warning: function index out of bounds in name section, local "
               "subsection: "
            << std::to_string(funcIndex) << std::endl;
        }
        auto numLocals = getU32LEB();
        NameProcessor processor;
        for (size_t j = 0; j < numLocals; j++) {
          auto localIndex = getU32LEB();
          auto rawLocalName = getInlineString();
          if (!func) {
            continue; // read and discard in case of prior error
          }
          auto localName = processor.process(rawLocalName);
          if (localName.size() == 0) {
            std::cerr << "warning: empty local name at index "
                      << std::to_string(localIndex) << " in function "
                      << std::string(func->name.str) << std::endl;
          } else if (localIndex < func->getNumLocals()) {
            func->localNames[localIndex] = localName;
          } else {
            std::cerr << "warning: local index out of bounds in name "
                         "section, local subsection: "
                      << std::string(rawLocalName.str) << " at index "
                      << std::to_string(localIndex) << " in function "
                      << std::string(func->name.str) << std::endl;
          }
        }
      }
    } else if (nameType == Subsection::NameType) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < types.size()) {
          wasm.typeNames[types[index]].name = name;
        } else {
          std::cerr << "warning: type index out of bounds in name section, "
                       "type subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameTable) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);

        if (index < wasm.tables.size()) {
          auto* table = wasm.tables[index].get();
          for (auto& segment : wasm.elementSegments) {
            if (segment->table == table->name) {
              segment->table = name;
            }
          }
          table->setExplicitName(name);
        } else {
          std::cerr << "warning: table index out of bounds in name section, "
                       "table subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameElem) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);

        if (index < wasm.elementSegments.size()) {
          wasm.elementSegments[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: elem index out of bounds in name section, "
                       "elem subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameMemory) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.memories.size()) {
          wasm.memories[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: memory index out of bounds in name section, "
                       "memory subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameData) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.dataSegments.size()) {
          wasm.dataSegments[i]->setExplicitName(name);
        } else {
          std::cerr << "warning: data index out of bounds in name section, "
                       "data subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameGlobal) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.globals.size()) {
          wasm.globals[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: global index out of bounds in name section, "
                       "global subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameField) {
      auto numTypes = getU32LEB();
      for (size_t i = 0; i < numTypes; i++) {
        auto typeIndex = getU32LEB();
        bool validType =
          typeIndex < types.size() && types[typeIndex].isStruct();
        if (!validType) {
          std::cerr << "warning: invalid field index in name field section\n";
        }
        auto numFields = getU32LEB();
        NameProcessor processor;
        for (size_t i = 0; i < numFields; i++) {
          auto fieldIndex = getU32LEB();
          auto rawName = getInlineString();
          auto name = processor.process(rawName);
          if (validType) {
            wasm.typeNames[types[typeIndex]].fieldNames[fieldIndex] = name;
          }
        }
      }
    } else if (nameType == Subsection::NameTag) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.tags.size()) {
          wasm.tags[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: tag index out of bounds in name section, "
                       "tag subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else {
      std::cerr << "warning: unknown name subsection with id "
                << std::to_string(nameType) << " at " << pos << std::endl;
      pos = subsectionPos + subsectionSize;
    }
    if (pos != subsectionPos + subsectionSize) {
      throwError("bad names subsection position change");
    }
  }
  if (pos != sectionPos + payloadLen) {
    throwError("bad names section position change");
  }
}